

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestEventStream.cpp
# Opt level: O3

ostream * binlog::operator<<(ostream *out,WriterProp *a)

{
  ostream *poVar1;
  
  std::__ostream_insert<char,std::char_traits<char>>(out,"WriterProp{",0xb);
  std::__ostream_insert<char,std::char_traits<char>>(out," id: ",5);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)out);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," name: ",7);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,(a->name)._M_dataplus._M_p,(a->name)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," batchSize: ",0xc);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," }",2);
  return poVar1;
}

Assistant:

std::ostream& operator<<(std::ostream& out, const WriterProp& a)
{
  return
  out << "WriterProp{"
      << " id: " << a.id
      << " name: " << a.name
      << " batchSize: " << a.batchSize << " }";
}